

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int socket_server_connect(socket_server *ss,uintptr_t opaque,char *addr,int port)

{
  int iVar1;
  undefined1 local_238 [4];
  int len;
  request_package request;
  int port_local;
  char *addr_local;
  uintptr_t opaque_local;
  socket_server *ss_local;
  
  request.dummy._252_4_ = port;
  iVar1 = open_request(ss,(request_package *)local_238,opaque,addr,port);
  if (iVar1 < 0) {
    ss_local._4_4_ = -1;
  }
  else {
    send_request(ss,(request_package *)local_238,'O',iVar1 + 0x18);
    ss_local._4_1_ = request.header[0];
    ss_local._5_1_ = request.header[1];
    ss_local._6_1_ = request.header[2];
    ss_local._7_1_ = request.header[3];
  }
  return ss_local._4_4_;
}

Assistant:

int 
socket_server_connect(struct socket_server *ss, uintptr_t opaque, const char * addr, int port) {
	struct request_package request;
	int len = open_request(ss, &request, opaque, addr, port);
	if (len < 0)
		return -1;
	send_request(ss, &request, 'O', sizeof(request.u.open) + len);
	return request.u.open.id;
}